

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * sqlite3KeyInfoOfIndex(Parse *pParse,Index *pIdx)

{
  ushort uVar1;
  char *zName;
  long in_RSI;
  long in_RDI;
  char *zColl;
  KeyInfo *pKey;
  int nKey;
  int nCol;
  int i;
  undefined8 in_stack_ffffffffffffffc0;
  int N;
  CollSeq *pCVar2;
  sqlite3 *in_stack_ffffffffffffffc8;
  int local_1c;
  Parse *local_8;
  
  uVar1 = *(ushort *)(in_RSI + 0x60);
  if (*(int *)(in_RDI + 0x34) == 0) {
    N = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
    if ((*(ushort *)(in_RSI + 99) >> 3 & 1) == 0) {
      local_8 = (Parse *)sqlite3KeyInfoAlloc(in_stack_ffffffffffffffc8,N,
                                             (int)in_stack_ffffffffffffffc0);
    }
    else {
      local_8 = (Parse *)sqlite3KeyInfoAlloc(in_stack_ffffffffffffffc8,N,
                                             (int)in_stack_ffffffffffffffc0);
    }
    if (local_8 != (Parse *)0x0) {
      for (local_1c = 0; local_1c < (int)(uint)uVar1; local_1c = local_1c + 1) {
        zName = *(char **)(*(long *)(in_RSI + 0x40) + (long)local_1c * 8);
        if (zName == "BINARY") {
          pCVar2 = (CollSeq *)0x0;
        }
        else {
          pCVar2 = sqlite3LocateCollSeq(local_8,zName);
        }
        *(CollSeq **)(&local_8->isMultiWrite + (long)local_1c * 8) = pCVar2;
        *(undefined1 *)(*(long *)&local_8->rc + (long)local_1c) =
             *(undefined1 *)(*(long *)(in_RSI + 0x38) + (long)local_1c);
      }
      if (*(int *)(in_RDI + 0x34) != 0) {
        if ((*(ushort *)(in_RSI + 99) >> 9 & 1) == 0) {
          *(ushort *)(in_RSI + 99) = *(ushort *)(in_RSI + 99) & 0xfdff | 0x200;
          *(undefined4 *)(in_RDI + 0x18) = 0x201;
        }
        sqlite3KeyInfoUnref((KeyInfo *)0x1c9044);
        local_8 = (Parse *)0x0;
      }
    }
  }
  else {
    local_8 = (Parse *)0x0;
  }
  return (KeyInfo *)local_8;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoOfIndex(Parse *pParse, Index *pIdx){
  int i;
  int nCol = pIdx->nColumn;
  int nKey = pIdx->nKeyCol;
  KeyInfo *pKey;
  if( pParse->nErr ) return 0;
  if( pIdx->uniqNotNull ){
    pKey = sqlite3KeyInfoAlloc(pParse->db, nKey, nCol-nKey);
  }else{
    pKey = sqlite3KeyInfoAlloc(pParse->db, nCol, 0);
  }
  if( pKey ){
    assert( sqlite3KeyInfoIsWriteable(pKey) );
    for(i=0; i<nCol; i++){
      const char *zColl = pIdx->azColl[i];
      pKey->aColl[i] = zColl==sqlite3StrBINARY ? 0 :
                        sqlite3LocateCollSeq(pParse, zColl);
      pKey->aSortFlags[i] = pIdx->aSortOrder[i];
      assert( 0==(pKey->aSortFlags[i] & KEYINFO_ORDER_BIGNULL) );
    }
    if( pParse->nErr ){
      assert( pParse->rc==SQLITE_ERROR_MISSING_COLLSEQ );
      if( pIdx->bNoQuery==0 ){
        /* Deactivate the index because it contains an unknown collating
        ** sequence.  The only way to reactive the index is to reload the
        ** schema.  Adding the missing collating sequence later does not
        ** reactive the index.  The application had the chance to register
        ** the missing index using the collation-needed callback.  For
        ** simplicity, SQLite will not give the application a second chance.
        */
        pIdx->bNoQuery = 1;
        pParse->rc = SQLITE_ERROR_RETRY;
      }
      sqlite3KeyInfoUnref(pKey);
      pKey = 0;
    }
  }
  return pKey;
}